

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PoolingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_pooling(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  PoolingLayerParams *pPVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_pooling(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_pooling(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pPVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::PoolingLayerParams>(arena);
    (this->layer_).pooling_ = pPVar2;
  }
  return (PoolingLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PoolingLayerParams* NeuralNetworkLayer::_internal_mutable_pooling() {
  if (!_internal_has_pooling()) {
    clear_layer();
    set_has_pooling();
    layer_.pooling_ = CreateMaybeMessage< ::CoreML::Specification::PoolingLayerParams >(GetArenaForAllocation());
  }
  return layer_.pooling_;
}